

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O2

bool __thiscall FTagManager::SectorHasTag(FTagManager *this,int i,int tag)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  bool bVar4;
  
  bVar4 = false;
  if ((-1 < i) && (bVar4 = false, i < (int)(this->startForSector).Count)) {
    lVar2 = (long)(this->startForSector).Array[(uint)i];
    if (lVar2 < 0) {
      return false;
    }
    piVar3 = &(this->allTags).Array[lVar2].tag;
    do {
      bVar4 = ((FTagItem *)(piVar3 + -1))->target == i;
      if (!bVar4) {
        return bVar4;
      }
      iVar1 = *piVar3;
      piVar3 = piVar3 + 3;
    } while (iVar1 != tag);
  }
  return bVar4;
}

Assistant:

bool FTagManager::SectorHasTag(int i, int tag) const
{
	if (SectorHasTags(i))
	{
		int ndx = startForSector[i];
		while (allTags[ndx].target == i)
		{
			if (allTags[ndx].tag == tag) return true;
			ndx++;
		}
	}
	return false;
}